

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall ACSStringPool::PurgeStrings(ACSStringPool *this)

{
  uint *__s;
  byte *pbVar1;
  PoolEntry *pPVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  FString *this_00;
  long lVar6;
  
  __s = this->PoolBuckets;
  memset(__s,0xff,0x3ec);
  uVar3 = (this->Pool).Count;
  if (uVar3 != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pPVar2 = (this->Pool).Array;
      if (*(int *)((long)&pPVar2->Next + lVar6) != -2) {
        if (*(int *)((long)&pPVar2->LockCount + lVar6) == 0) {
          this_00 = (FString *)((long)&(pPVar2->Str).Chars + lVar6);
          *(undefined4 *)((long)&this_00[1].Chars + 4) = 0xfffffffe;
          if (uVar5 < this->FirstFreeEntry) {
            this->FirstFreeEntry = (uint)uVar5;
          }
          FString::operator=(this_00,(char *)"");
          uVar3 = (this->Pool).Count;
        }
        else {
          uVar4 = *(uint *)((long)&pPVar2->Hash + lVar6) % 0xfb;
          *(uint *)((long)&pPVar2->Next + lVar6) = __s[uVar4];
          __s[uVar4] = (uint)uVar5;
          pbVar1 = (byte *)((long)&pPVar2->LockCount + lVar6 + 3);
          *pbVar1 = *pbVar1 & 0x7f;
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void ACSStringPool::PurgeStrings()
{
	// Clear the hash buckets. We'll rebuild them as we decide what strings
	// to keep and which to toss.
	memset(PoolBuckets, 0xFF, sizeof(PoolBuckets));
	size_t usedcount = 0, freedcount = 0;
	for (unsigned int i = 0; i < Pool.Size(); ++i)
	{
		PoolEntry *entry = &Pool[i];
		if (entry->Next != FREE_ENTRY)
		{
			if (entry->LockCount == 0)
			{
				freedcount++;
				// Mark this entry as free.
				entry->Next = FREE_ENTRY;
				if (i < FirstFreeEntry)
				{
					FirstFreeEntry = i;
				}
				// And free the string.
				entry->Str = "";
			}
			else
			{
				usedcount++;
				// Rehash this entry.
				unsigned int h = entry->Hash % NUM_BUCKETS;
				entry->Next = PoolBuckets[h];
				PoolBuckets[h] = i;
				// Remove MarkString's mark.
				entry->LockCount &= 0x7FFFFFFF;
			}
		}
	}
}